

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetStyle::unpolish(QStyleSheetStyle *this,QApplication *app)

{
  QStyle *pQVar1;
  QHash<const_void_*,_QCss::StyleSheet> *this_00;
  QStyleSheetStyle *in_RSI;
  QStyleSheetStyle *in_RDI;
  long in_FS_OFFSET;
  QStyleSheetStyleRecursionGuard recursion_guard;
  QCoreApplication *local_18;
  QStyleSheetStyleRecursionGuard local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = baseStyle(in_RSI);
  (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,in_RSI);
  if ((globalStyleSheetStyle == (QStyleSheetStyle *)0x0) || (globalStyleSheetStyle == in_RDI)) {
    local_9.guarded = true;
    QStyleSheetStyleRecursionGuard::QStyleSheetStyleRecursionGuard(&local_9,in_RDI);
    QHash<const_QObject_*,_QList<QCss::StyleRule>_>::clear
              ((QHash<const_QObject_*,_QList<QCss::StyleRule>_> *)in_RDI);
    QHash<const_QObject_*,_QHash<int,_bool>_>::clear
              ((QHash<const_QObject_*,_QHash<int,_bool>_> *)in_RDI);
    QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_>::clear
              ((QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_> *)
               in_RDI);
    this_00 = &styleSheetCaches->styleSheetCache;
    local_18 = QCoreApplication::instance();
    QHash<const_void_*,_QCss::StyleSheet>::remove(this_00,(char *)&local_18);
    QStyleSheetStyleRecursionGuard::~QStyleSheetStyleRecursionGuard(&local_9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStyleSheetStyle::unpolish(QApplication *app)
{
    baseStyle()->unpolish(app);
    RECURSION_GUARD(return)
    styleSheetCaches->styleRulesCache.clear();
    styleSheetCaches->hasStyleRuleCache.clear();
    styleSheetCaches->renderRulesCache.clear();
    styleSheetCaches->styleSheetCache.remove(qApp);
}